

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

DynamicRectMatrix<double> __thiscall
OpenMD::Polynomial<double>::CreateCompanion(Polynomial<double> *this)

{
  _Rb_tree_node_base *p_Var1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Polynomial<double> *in_RSI;
  ulong uVar3;
  _Rb_tree_color nrow;
  ulong uVar4;
  double dVar5;
  double dVar6;
  DynamicRectMatrix<double> DVar7;
  
  nrow = _S_red;
  for (p_Var1 = (in_RSI->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(in_RSI->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if ((int)nrow < (int)p_Var1[1]._M_color) {
      nrow = p_Var1[1]._M_color;
    }
  }
  DynamicRectMatrix<double>::DynamicRectMatrix((DynamicRectMatrix<double> *)this,nrow,nrow);
  dVar5 = getCoefficient(in_RSI,nrow);
  uVar2 = extraout_RDX;
  if (0 < (int)nrow) {
    uVar4 = 0;
    do {
      uVar3 = 0;
      do {
        dVar6 = 1.0;
        if (uVar4 - 1 == uVar3) {
LAB_0022535e:
          *(double *)
           (*(long *)(*(long *)&(this->polyPairMap_)._M_t._M_impl + uVar4 * 8) + uVar3 * 8) = dVar6;
        }
        else if (nrow - _S_black == uVar3) {
          dVar6 = getCoefficient(in_RSI,(ExponentType)uVar4);
          dVar6 = -dVar6 / dVar5;
          uVar2 = extraout_RDX_00;
          goto LAB_0022535e;
        }
        uVar3 = uVar3 + 1;
      } while (nrow != uVar3);
      uVar4 = uVar4 + 1;
    } while (uVar4 != nrow);
  }
  DVar7.nrow_ = (int)uVar2;
  DVar7.ncol_ = (int)((ulong)uVar2 >> 0x20);
  DVar7.data_ = (double **)this;
  return DVar7;
}

Assistant:

DynamicRectMatrix<Real> CreateCompanion() {
      int rank = degree();
      DynamicRectMatrix<Real> mat(rank, rank);
      Real majorCoeff = getCoefficient(rank);
      for (int i = 0; i < rank; ++i) {
        for (int j = 0; j < rank; ++j) {
          if (i - j == 1) {
            mat(i, j) = 1;
          } else if (j == rank - 1) {
            mat(i, j) = -1 * getCoefficient(i) / majorCoeff;
          }
        }
      }
      return mat;
    }